

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O0

bool __thiscall Condition::Wait(Condition *this,Mutex *mutex,uint32_t timeoutms)

{
  int iVar1;
  undefined1 local_38 [8];
  timespec timeout;
  uint32_t timeoutms_local;
  Mutex *mutex_local;
  Condition *this_local;
  
  timeout.tv_nsec._4_4_ = timeoutms;
  if (timeoutms == 0) {
    Wait(this,mutex);
  }
  else {
    TimeUtils::getCurTime((timespec *)local_38);
    TimeUtils::addOffset((timespec *)local_38,timeout.tv_nsec._4_4_);
    iVar1 = pthread_cond_timedwait
                      ((pthread_cond_t *)this,(pthread_mutex_t *)mutex,(timespec *)local_38);
    if (iVar1 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Condition::Wait( Mutex &mutex, uint32_t timeoutms )
{
	if ( timeoutms > 0 )
	{
		struct timespec timeout;
		TimeUtils::getCurTime( &timeout );
		TimeUtils::addOffset( &timeout, timeoutms );
		if ( pthread_cond_timedwait( &mCond, &mutex.mMutex, &timeout ) != 0 )
			return false;
	}
	else
		Wait( mutex );
	
	return true;
}